

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_scan_for_html_closer
              (MD_CTX *ctx,MD_CHAR *str,MD_SIZE len,MD_LINE *lines,MD_SIZE n_lines,MD_OFFSET beg,
              MD_OFFSET max_end,MD_OFFSET *p_end,MD_OFFSET *p_scan_horizon)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long in_RCX;
  int in_EDX;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  MD_SIZE line_index;
  MD_OFFSET off;
  MD_CHAR *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  uint local_38;
  uint local_34;
  
  local_38 = 0;
  local_34 = in_R9D;
  if ((*(uint *)CONCAT44(n_lines,beg) <= in_R9D) ||
     (*(uint *)CONCAT44(n_lines,beg) < in_stack_00000008 - in_EDX)) {
    while( true ) {
      for (; bVar2 = local_34 + in_EDX <= *(uint *)(in_RCX + 4 + (ulong)local_38 * 8),
          bVar1 = local_34 + in_EDX <= in_stack_00000008, bVar2 && bVar1; local_34 = local_34 + 1) {
        iVar3 = md_ascii_eq((MD_CHAR *)CONCAT17(bVar2 && bVar1,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8,0);
        if (iVar3 != 0) {
          *_line_index = local_34 + in_EDX;
          return 1;
        }
      }
      local_38 = local_38 + 1;
      if ((in_stack_00000008 <= local_34) || (in_R8D <= local_38)) break;
      local_34 = *(uint *)(in_RCX + (ulong)local_38 * 8);
    }
    *(uint *)CONCAT44(n_lines,beg) = local_34;
  }
  return 0;
}

Assistant:

static int
md_scan_for_html_closer(MD_CTX* ctx, const MD_CHAR* str, MD_SIZE len,
                        const MD_LINE* lines, MD_SIZE n_lines,
                        OFF beg, OFF max_end, OFF* p_end,
                        OFF* p_scan_horizon)
{
    OFF off = beg;
    MD_SIZE line_index = 0;

    if(off < *p_scan_horizon  &&  *p_scan_horizon >= max_end - len) {
        /* We have already scanned the range up to the max_end so we know
         * there is nothing to see. */
        return FALSE;
    }

    while(TRUE) {
        while(off + len <= lines[line_index].end  &&  off + len <= max_end) {
            if(md_ascii_eq(STR(off), str, len)) {
                /* Success. */
                *p_end = off + len;
                return TRUE;
            }
            off++;
        }

        line_index++;
        if(off >= max_end  ||  line_index >= n_lines) {
            /* Failure. */
            *p_scan_horizon = off;
            return FALSE;
        }

        off = lines[line_index].beg;
    }
}